

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Model::~Model(Model *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  pointer ppNVar2;
  pointer ppGVar3;
  pointer ppMVar4;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Model_00259da0;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->culling)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->culling).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->shading)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->shading).field_2) {
    operator_delete(pcVar1);
  }
  ppNVar2 = (this->attributes).
            super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2);
  }
  ppGVar3 = (this->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppGVar3 != (pointer)0x0) {
    operator_delete(ppGVar3);
  }
  ppMVar4 = (this->materials).
            super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar4 != (pointer)0x0) {
    operator_delete(ppMVar4);
  }
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Model::~Model()
{

}